

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

string * __thiscall
picojson::parse_abi_cxx11_(string *__return_storage_ptr__,picojson *this,value *out,istream *is)

{
  istream *out_00;
  streambuf_type *__s;
  istreambuf_iterator<char,_std::char_traits<char>_> local_58 [2];
  istreambuf_iterator<char,_std::char_traits<char>_> local_38;
  undefined1 local_21;
  value *local_20;
  istream *is_local;
  value *out_local;
  string *err;
  
  local_21 = 0;
  local_20 = out;
  is_local = (istream *)this;
  out_local = (value *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  out_00 = is_local;
  __s = (streambuf_type *)std::ios::rdbuf();
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(&local_38,__s);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(local_58);
  parse<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((value *)out_00,&local_38,local_58,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::string parse(value& out, std::istream& is) {
    std::string err;
    parse(out, std::istreambuf_iterator<char>(is.rdbuf()),
      std::istreambuf_iterator<char>(), &err);
    return err;
  }